

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  cbtQuantizedBvhNode *pcVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  float fVar52;
  undefined1 auVar53 [64];
  undefined8 local_d8;
  float local_d0 [2];
  undefined8 local_c8;
  float local_c0;
  undefined4 uStack_bc;
  cbtNodeOverlapCallback *local_b0;
  float *local_a8;
  float *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar19 = 0;
  if (startNodeIndex < endNodeIndex) {
    auVar40._8_8_ = 0;
    auVar40._0_8_ = *(ulong *)rayTarget->m_floats;
    fVar1 = rayTarget->m_floats[2];
    auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *(ulong *)raySource->m_floats;
    fVar2 = raySource->m_floats[2];
    auVar22 = vsubps_avx(auVar40,auVar43);
    fVar11 = fVar1 - fVar2;
    auVar29 = vmovshdup_avx(auVar22);
    auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar29._0_4_ * auVar29._0_4_)),auVar22,auVar22);
    auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    auVar29 = vsqrtss_avx(auVar29,auVar29);
    fVar28 = 1.0 / auVar29._0_4_;
    fVar52 = fVar11 * fVar28;
    auVar47._0_4_ = fVar28 * auVar22._0_4_;
    auVar47._4_4_ = fVar28 * auVar22._4_4_;
    auVar47._8_4_ = fVar28 * auVar22._8_4_;
    auVar47._12_4_ = fVar28 * auVar22._12_4_;
    auVar29._0_4_ = auVar47._0_4_ * auVar22._0_4_;
    auVar29._4_4_ = auVar47._4_4_ * auVar22._4_4_;
    auVar29._8_4_ = auVar47._8_4_ * auVar22._8_4_;
    auVar29._12_4_ = auVar47._12_4_ * auVar22._12_4_;
    uVar12 = vcmpps_avx512vl(auVar47,ZEXT816(0) << 0x40,0);
    auVar29 = vmovshdup_avx(auVar29);
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar29 = vfmadd231ss_fma(auVar29,auVar47,auVar22);
    local_48 = vfmadd231ss_fma(auVar29,ZEXT416((uint)fVar52),ZEXT416((uint)fVar11));
    auVar49 = ZEXT1664(local_48);
    auVar10 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
    fVar1 = (this->m_bvhAabbMin).m_floats[2];
    auVar29 = vdivps_avx(auVar30,auVar47);
    fVar2 = (this->m_bvhQuantization).m_floats[2];
    auVar10 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar10._0_4_ + aabbMin->m_floats[2])))
    ;
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar22._0_4_ + aabbMax->m_floats[2])))
    ;
    auVar30 = ZEXT416((uint)(this->m_bvhAabbMax).m_floats[2]);
    auVar10 = vminss_avx(auVar30,auVar10);
    auVar30 = vminss_avx(auVar30,auVar22);
    uVar3 = *(ulong *)(this->m_bvhAabbMax).m_floats;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar3;
    auVar22 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar6 = (bool)((byte)uVar12 & 1);
    local_58._0_4_ = (float)((uint)bVar6 * auVar22._0_4_ | (uint)!bVar6 * auVar29._0_4_);
    bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
    local_58._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar29._4_4_;
    bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
    local_58._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar29._8_4_;
    bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
    local_58._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar29._12_4_;
    auVar51 = ZEXT1664(local_58);
    uVar14 = vcmpss_avx512f(ZEXT416((uint)fVar52),ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar14 & 1);
    fVar52 = (float)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / fVar52));
    auVar29 = vmaxps_avx(auVar40,auVar43);
    auVar22 = vminps_avx(auVar40,auVar43);
    auVar40 = vmovshdup_avx(auVar45);
    auVar35._0_4_ = auVar29._0_4_ + (float)*(undefined8 *)aabbMax->m_floats;
    auVar35._4_4_ = auVar29._4_4_ + (float)((ulong)*(undefined8 *)aabbMax->m_floats >> 0x20);
    auVar35._8_4_ = auVar29._8_4_ + 0.0;
    auVar35._12_4_ = auVar29._12_4_ + 0.0;
    uVar12 = *(ulong *)(this->m_bvhAabbMin).m_floats;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar12;
    local_68 = ZEXT416((uint)fVar52);
    auVar41._0_4_ = auVar22._0_4_ + (float)*(undefined8 *)aabbMin->m_floats;
    auVar41._4_4_ = auVar22._4_4_ + (float)((ulong)*(undefined8 *)aabbMin->m_floats >> 0x20);
    auVar41._8_4_ = auVar22._8_4_ + 0.0;
    auVar41._12_4_ = auVar22._12_4_ + 0.0;
    auVar29 = vmaxps_avx(auVar38,auVar35);
    auVar22 = vmaxps_avx(auVar38,auVar41);
    auVar29 = vminps_avx(auVar45,auVar29);
    uVar13 = vcmpps_avx512vl(auVar45,auVar22,1);
    auVar35 = vmovshdup_avx(auVar22);
    auVar41 = vsubps_avx(auVar29,auVar38);
    bVar16 = (byte)(uVar13 >> 1);
    auVar29 = vmovshdup_avx(auVar38);
    uVar4 = *(ulong *)(this->m_bvhQuantization).m_floats;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar4;
    auVar38 = vmovshdup_avx(auVar48);
    auVar36._8_2_ = 1;
    auVar36._0_8_ = 0x1000100010001;
    auVar36._10_2_ = 1;
    auVar36._12_2_ = 1;
    auVar36._14_2_ = 1;
    auVar31._0_4_ = (int)((float)uVar4 * auVar41._0_4_ + 1.0);
    auVar31._4_4_ = (int)((float)(uVar4 >> 0x20) * auVar41._4_4_ + 1.0);
    auVar31._8_4_ = (int)(auVar41._8_4_ * 0.0 + 1.0);
    auVar31._12_4_ = (int)(auVar41._12_4_ * 0.0 + 1.0);
    auVar41 = vpackusdw_avx(auVar31,auVar31);
    local_78 = vpor_avx(auVar41,auVar36);
    auVar46 = ZEXT1664(local_78);
    auVar41 = vmovshdup_avx(local_58);
    pcVar20 = (this->m_quantizedContiguousNodes).m_data + startNodeIndex;
    local_98 = (uint *)((long)&local_d8 + (ulong)(auVar41._0_4_ < 0.0) * 0x10 + 4);
    local_88 = (uint *)((long)&local_d8 + (ulong)(0.0 <= auVar41._0_4_) * 0x10 + 4);
    local_a8 = local_d0 + (ulong)(fVar52 < 0.0) * 4;
    local_a0 = local_d0 + (ulong)(0.0 <= fVar52) * 4;
    local_80 = (uint *)(&local_d8 + (ulong)(local_58._0_4_ < 0.0) * 2);
    local_90 = (uint *)(&local_d8 + (ulong)(0.0 <= local_58._0_4_) * 2);
    iVar19 = 0;
    local_b0 = nodeCallback;
    do {
      uVar21 = 0;
      uVar18 = 0;
      if (pcVar20->m_quantizedAabbMax[0] <
          ((ushort)(int)((float)uVar4 *
                        ((float)((uint)((byte)uVar13 & 1) * (int)uVar3 +
                                (uint)!(bool)((byte)uVar13 & 1) * auVar22._0_4_) - (float)uVar12)) &
          0xfffe)) {
LAB_008a7c53:
        if ((-1 < pcVar20->m_escapeIndexOrTriangleIndex) || ((uVar21 & 1) != 0)) goto LAB_008a7c6c;
        startNodeIndex = startNodeIndex - pcVar20->m_escapeIndexOrTriangleIndex;
        pcVar20 = pcVar20 + -(long)pcVar20->m_escapeIndexOrTriangleIndex;
      }
      else {
        uVar15 = vpcmpuw_avx512vl(auVar46._0_16_,ZEXT416(*(uint *)pcVar20->m_quantizedAabbMin),1);
        if (((((uVar15 & 1) != 0) ||
             (pcVar20->m_quantizedAabbMax[2] <
              ((ushort)(int)(fVar2 * (auVar10._0_4_ - fVar1)) & 0xfffe))) ||
            (uVar21 = uVar18,
            (ushort)((ushort)(int)(fVar2 * (auVar30._0_4_ - fVar1) + 1.0) | 1) <
            pcVar20->m_quantizedAabbMin[2])) ||
           ((pcVar20->m_quantizedAabbMax[1] <
             ((ushort)(int)(auVar38._0_4_ *
                           ((float)((uint)(bVar16 & 1) * auVar40._0_4_ +
                                   (uint)!(bool)(bVar16 & 1) * auVar35._0_4_) - auVar29._0_4_)) &
             0xfffe) || ((uVar15 >> 1 & 1) != 0)))) goto LAB_008a7c53;
        fVar11 = (this->m_bvhQuantization).m_floats[2];
        auVar41 = vpmovzxwd_avx(ZEXT416(*(uint *)pcVar20->m_quantizedAabbMin));
        fVar28 = (this->m_bvhAabbMin).m_floats[2];
        auVar41 = vcvtdq2ps_avx(auVar41);
        fVar9 = (float)pcVar20->m_quantizedAabbMin[2] / fVar11 + fVar28;
        auVar39._4_12_ = auVar50._4_12_;
        auVar39._0_4_ = fVar9;
        uVar14 = vmovlps_avx(auVar39);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(this->m_bvhQuantization).m_floats;
        auVar41 = vdivps_avx(auVar41,auVar42);
        uVar5 = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
        fVar7 = (float)uVar5;
        auVar25._0_4_ = auVar41._0_4_ + fVar7;
        fVar8 = (float)((ulong)uVar5 >> 0x20);
        auVar25._4_4_ = auVar41._4_4_ + fVar8;
        auVar25._8_4_ = auVar41._8_4_ + 0.0;
        auVar25._12_4_ = auVar41._12_4_ + 0.0;
        fVar28 = fVar28 + (float)pcVar20->m_quantizedAabbMax[2] / fVar11;
        vmovlps_avx(auVar25);
        auVar37._4_12_ = auVar50._4_12_;
        auVar37._0_4_ = fVar28;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)aabbMax->m_floats;
        auVar41 = vsubps_avx(auVar25,auVar44);
        local_d8 = vmovlps_avx(auVar41);
        local_d0[1] = (float)((ulong)uVar14 >> 0x20);
        local_d0[0] = fVar9 - aabbMax->m_floats[2];
        uVar14 = vmovlps_avx(auVar37);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)aabbMin->m_floats;
        auVar41 = vpmovzxwd_avx(ZEXT416(*(uint *)pcVar20->m_quantizedAabbMax));
        auVar41 = vcvtdq2ps_avx(auVar41);
        auVar41 = vdivps_avx(auVar41,auVar42);
        auVar26._0_4_ = fVar7 + auVar41._0_4_;
        auVar26._4_4_ = fVar8 + auVar41._4_4_;
        auVar26._8_4_ = auVar41._8_4_ + 0.0;
        auVar26._12_4_ = auVar41._12_4_ + 0.0;
        auVar41 = vsubps_avx(auVar26,auVar32);
        local_c8 = vmovlps_avx(auVar41);
        _local_c0 = CONCAT44((int)((ulong)uVar14 >> 0x20),fVar28 - aabbMin->m_floats[2]);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)raySource->m_floats;
        auVar41 = vinsertps_avx(ZEXT416(*local_80),ZEXT416(*local_88),0x10);
        auVar41 = vsubps_avx(auVar41,auVar33);
        auVar27._0_4_ = auVar51._0_4_ * auVar41._0_4_;
        auVar27._4_4_ = auVar51._4_4_ * auVar41._4_4_;
        auVar27._8_4_ = auVar51._8_4_ * auVar41._8_4_;
        auVar27._12_4_ = auVar51._12_4_ * auVar41._12_4_;
        auVar41 = vmovshdup_avx(auVar27);
        if (auVar41._0_4_ < auVar27._0_4_) {
LAB_008a7c51:
          uVar21 = 0;
          goto LAB_008a7c53;
        }
        auVar31 = vinsertps_avx(ZEXT416(*local_90),ZEXT416(*local_98),0x10);
        auVar31 = vsubps_avx(auVar31,auVar33);
        auVar34._0_4_ = auVar51._0_4_ * auVar31._0_4_;
        auVar34._4_4_ = auVar51._4_4_ * auVar31._4_4_;
        auVar34._8_4_ = auVar51._8_4_ * auVar31._8_4_;
        auVar34._12_4_ = auVar51._12_4_ * auVar31._12_4_;
        auVar31 = vmovshdup_avx(auVar34);
        if (auVar34._0_4_ < auVar31._0_4_) goto LAB_008a7c51;
        auVar36 = vshufps_avx(auVar34,auVar34,0xe1);
        uVar15 = vcmpps_avx512vl(auVar27,auVar36,1);
        auVar23._4_12_ = auVar27._4_12_;
        auVar23._0_4_ =
             (float)((uint)((byte)uVar15 & 1) * (int)auVar31._0_4_ +
                    (uint)!(bool)((byte)uVar15 & 1) * (int)auVar27._0_4_);
        fVar11 = fVar52 * (*local_a0 - raySource->m_floats[2]);
        if (fVar11 < auVar23._0_4_) goto LAB_008a7c51;
        bVar17 = (byte)(uVar15 >> 1);
        auVar24._4_12_ = auVar34._4_12_;
        auVar24._0_4_ =
             (float)((uint)(bVar17 & 1) * (int)auVar41._0_4_ +
                    (uint)!(bool)(bVar17 & 1) * (int)auVar34._0_4_);
        fVar28 = fVar52 * (*local_a8 - raySource->m_floats[2]);
        if (auVar24._0_4_ < fVar28) goto LAB_008a7c51;
        auVar41 = vmaxss_avx(ZEXT416((uint)fVar28),auVar23);
        auVar31 = vminss_avx(ZEXT416((uint)fVar11),auVar24);
        uVar14 = vcmpps_avx512vl(auVar41,auVar49._0_16_,1);
        uVar5 = vcmpps_avx512vl(auVar53._0_16_,auVar31,1);
        uVar21 = (uint)uVar14 & (uint)uVar5;
        if ((pcVar20->m_escapeIndexOrTriangleIndex < 0) || ((uVar21 & 1) == 0)) goto LAB_008a7c53;
        (*local_b0->_vptr_cbtNodeOverlapCallback[2])
                  (local_b0,(ulong)(uint)(pcVar20->m_escapeIndexOrTriangleIndex >> 0x15),
                   (ulong)(pcVar20->m_escapeIndexOrTriangleIndex & 0x1fffff));
        auVar46 = ZEXT1664(local_78);
        auVar51 = ZEXT1664(local_58);
        auVar49 = ZEXT1664(local_48);
        auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar50 = ZEXT1264(ZEXT812(0));
        fVar52 = (float)local_68._0_4_;
LAB_008a7c6c:
        pcVar20 = pcVar20 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      iVar19 = iVar19 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar19) {
    maxIterations = iVar19;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(m_useQuantization);

	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	cbtScalar lambda_max = 1.0;

#ifdef RAYAABB2
	cbtVector3 rayDirection = (rayTarget - raySource);
	rayDirection.normalize();
	lambda_max = rayDirection.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = {rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin, rayAabbMin, 0);
	quantizeWithClamp(quantizedQueryAabbMax, rayAabbMax, 1);

	while (curIndex < endNodeIndex)
	{
//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern cbtIDebugDraw* debugDrawerPtr;
		if (curIndex == drawPatch)
		{
			cbtVector3 aabbMin, aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			cbtVector3 color(1, 0, 0);
			debugDrawerPtr->drawAabb(aabbMin, aabbMax, color);
		}
#endif  //VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		cbtAssert(walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		cbtScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, rootNode->m_quantizedAabbMin, rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			cbtVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			cbtVector3 normal;
#if 0
			bool ra2 = cbtRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = cbtRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("cbtRayAabb2");
			rayBoxOverlap = cbtRayAabb2(raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);

#else
			rayBoxOverlap = true;  //cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}

		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(), rootNode->getTriangleIndex());
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}